

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.hpp
# Opt level: O1

void duckdb::StringParquetValueConversion::PlainSkip<true>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  StringColumnReader *pSVar1;
  idx_t iVar2;
  ulong req_len;
  
  pSVar1 = ColumnReader::Cast<duckdb::StringColumnReader>(reader);
  iVar2 = pSVar1->fixed_width_string_length;
  if (iVar2 == 0) {
    ByteBuffer::available(plain_data,4);
    iVar2 = (idx_t)*(uint *)plain_data->ptr;
    plain_data->len = plain_data->len - 4;
    plain_data->ptr = (data_ptr_t)((long)plain_data->ptr + 4);
  }
  req_len = iVar2 & 0xffffffff;
  ByteBuffer::available(plain_data,req_len);
  plain_data->len = plain_data->len - req_len;
  plain_data->ptr = plain_data->ptr + req_len;
  return;
}

Assistant:

static void PlainSkip(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &scr = reader.Cast<StringColumnReader>();
		uint32_t str_len =
		    scr.fixed_width_string_length == 0 ? plain_data.read<uint32_t>() : scr.fixed_width_string_length;
		plain_data.inc(str_len);
	}